

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void array_suite::test_int_four(void)

{
  int array [4];
  oarchive ar;
  ostringstream result;
  string local_218 [32];
  int local_1f8 [4];
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1f8[0] = 1;
  local_1f8[1] = 2;
  local_1f8[2] = 3;
  local_1f8[3] = 4;
  trial::protocol::json::basic_oarchive<char>::save_override<int[4]>(&local_1e8,&local_1f8);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[10]>
            ("result.str()","\"[1,2,3,4]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x123,"void array_suite::test_int_four()",local_218,"[1,2,3,4]");
  std::__cxx11::string::~string(local_218);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_int_four()
{
    std::ostringstream result;
    json::oarchive ar(result);
    int array[] = { 1, 2, 3, 4 };
    ar << array;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1,2,3,4]");
}